

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  GLfloat *this;
  long lVar1;
  undefined8 this_00;
  _Alloc_hider _Var2;
  GLfloat GVar3;
  int iVar4;
  MeshData *meshData;
  uint uVar5;
  undefined1 local_3c0 [8];
  GamepadInputHandler gamepad1;
  Text fpsCounter;
  GamepadState lastGamepad1State;
  Image woodImage;
  undefined1 auStack_1f8 [8];
  Triangle triangle;
  Application app;
  undefined1 local_170 [8];
  Mesh mesh;
  long local_138 [2];
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  undefined1 auStack_88 [8];
  Image grayBrickImage;
  Texture grayBrickTexture;
  Texture woodTexture;
  Texture houseTexture;
  
  printf("Application started!");
  putchar(10);
  fflush(_stdout);
  app._window = (GLFWwindow *)&app._windowName._M_string_length;
  triangle.scale = 1.0;
  app.screenScale = 0.0;
  app.vsyncEnabled = false;
  app._5_3_ = 0;
  app._windowName._M_dataplus._M_p = (pointer)0x0;
  app._windowName._M_string_length._0_1_ = 0;
  app._windowName.field_2._8_8_ = 0;
  app._windowWidth = 0;
  app._windowHeight = 0;
  app._inputHandlers.
  super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  app._inputHandlers.
  super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mesh._32_8_ = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mesh._scale,"GLEX Graphics Example","")
  ;
  Application::createWindow((Application *)&triangle.scale,(string *)&mesh._scale,0x280,0x1e0);
  if ((long *)mesh._32_8_ != local_138) {
    operator_delete((void *)mesh._32_8_,local_138[0] + 1);
  }
  lastGamepad1State.buttons[0] = '\0';
  lastGamepad1State.buttons[1] = '\0';
  lastGamepad1State.buttons[2] = '\0';
  lastGamepad1State.buttons[3] = '\0';
  lastGamepad1State.buttons[4] = '\0';
  lastGamepad1State.buttons[5] = '\0';
  lastGamepad1State.buttons[6] = '\0';
  fpsCounter._texture._height = 0;
  fpsCounter._204_3_ = 0;
  fpsCounter._207_1_ = 0;
  lastGamepad1State.buttons[8] = '\0';
  lastGamepad1State.buttons[9] = '\0';
  lastGamepad1State.buttons[10] = '\0';
  lastGamepad1State.buttons[0xb] = '\0';
  lastGamepad1State.buttons[0xc] = '\0';
  lastGamepad1State.buttons[0xd] = '\0';
  lastGamepad1State.buttons[0xe] = '\0';
  lastGamepad1State._15_1_ = 0;
  lastGamepad1State.analog[0] = 0.0;
  lastGamepad1State.analog[1] = 0.0;
  lastGamepad1State.analog[2] = 0.0;
  lastGamepad1State.analog[3] = 0.0;
  GamepadInputHandler::GamepadInputHandler((GamepadInputHandler *)local_3c0,'\0');
  woodImage.texture = (Texture *)&triangle.scale;
  std::function<void_(GamepadState)>::operator=
            ((function<void_(GamepadState)> *)&gamepad1._gamepadIndex,
             (function<void_(GamepadState)> *)&woodImage.texture);
  std::
  _Function_handler<void_(GamepadState),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/examples/GLEXGraphicsExample/main.cpp:68:39)>
  ::_M_manager((_Any_data *)&woodImage.texture,(_Any_data *)&woodImage.texture,__destroy_functor);
  gamepad1._gamepadName.field_2._8_8_ = (GamepadInputHandler *)local_3c0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<GamepadInputHandler*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&fpsCounter,
             (GamepadInputHandler *)local_3c0);
  this_00 = fpsCounter._0_8_;
  app._inputHandlers.
  super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)gamepad1._gamepadName.field_2._8_8_;
  gamepad1._gamepadName.field_2._8_8_ = 0;
  fpsCounter.x = 0.0;
  fpsCounter.y = 0.0;
  Application::addInputHandler
            ((Application *)&triangle.scale,
             (shared_ptr<InputHandler> *)
             &app._inputHandlers.
              super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (this_00 != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  if (fpsCounter._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)fpsCounter._0_8_);
  }
  grayBrickImage.texture = (Texture *)0x0;
  grayBrickTexture.id = 0;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,"images/gray_brick_512.jpg","");
  Texture::loadRGB((Texture *)&grayBrickImage.texture,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  grayBrickImage.z = (float)(int)app._windowName.field_2._12_4_;
  grayBrickImage.height = 0.0;
  grayBrickImage.windowScale = 0.0;
  grayBrickImage.rotationX = 1.0;
  auStack_88 = (undefined1  [8])((ulong)(uint)grayBrickImage.z << 0x20);
  grayBrickImage.y = (float)(int)app._windowName.field_2._8_4_;
  grayBrickImage.x = -100.0;
  grayBrickImage.width = triangle.scale;
  grayBrickTexture._width = 0;
  grayBrickTexture._height = 0;
  woodTexture.id = 0;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  grayBrickImage._32_8_ = &grayBrickImage.texture;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"images/wood1.bmp","");
  Texture::loadRGB((Texture *)&grayBrickTexture._width,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  woodImage.height = 0.0;
  woodImage.windowScale = 0.0;
  woodImage.rotationX = 1.0;
  lastGamepad1State.analog[4] = 250.0;
  lastGamepad1State.analog[5] = 420.0;
  woodImage.x = 10.0;
  woodImage.y = 100.0;
  woodImage.z = 100.0;
  woodImage.width = triangle.scale;
  triangle.height = 0.0;
  triangle.windowScale = 0.0;
  triangle.rotationX = 1.0;
  auStack_1f8._0_4_ = 250.0;
  auStack_1f8._4_4_ = 220.0;
  triangle.x = 10.0;
  triangle.y = 100.0;
  triangle.z = 100.0;
  triangle.width = triangle.scale;
  woodImage._32_8_ = &grayBrickTexture._width;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"meshes/house.obj","");
  meshData = MeshLoader::loadObjMesh(&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  woodTexture._width = 0;
  woodTexture._height = 0;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"images/house_512.png","");
  Texture::loadRGBA((Texture *)&woodTexture._width,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  Mesh::Mesh((Mesh *)local_170,meshData,(Texture *)&woodTexture._width,0.3);
  GVar3 = triangle.scale;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  Text::Text((Text *)((long)&gamepad1._gamepadName.field_2 + 8),(uint)(1.0 < GVar3),&local_a8,
             (FontColor)0x940115,20.0,20.0,100.0,triangle.scale,1.0,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  Text::createTexture((Text *)((long)&gamepad1._gamepadName.field_2 + 8));
  printf("\n\nPress L + R + Start to exit...");
  putchar(10);
  fflush(_stdout);
  this = &triangle.scale;
  while (iVar4 = Application::windowShouldClose((Application *)this), iVar4 == 0) {
    nbFrames = nbFrames + 1;
    currentTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    lVar1 = ((long)currentTime.__d.__r - (long)lastTime.__d.__r) / 1000000;
    timeDiff = (uint16_t)lVar1;
    uVar5 = (uint)lVar1;
    if (999 < (uVar5 & 0xfff8)) {
      fps = nbFrames;
      frameTime = (float)(uVar5 & 0xffff) / (float)nbFrames;
      nbFrames = 0;
      lastTime.__d.__r = currentTime.__d.__r;
    }
    Application::handleInput((Application *)this);
    Application::clear((Application *)this);
    Application::reshapeOrtho((Application *)this,1.0);
    Image::draw((Image *)auStack_88);
    Application::reshapeFrustum((Application *)this);
    Mesh::draw((Mesh *)local_170);
    local_170._0_4_ = (float)local_170._0_4_ + 0.75;
    local_170._4_4_ = (float)local_170._4_4_ + 0.75;
    mesh.rotationX = mesh.rotationX + 0.75;
    Application::reshapeOrtho((Application *)this,1.0);
    Image::draw((Image *)(lastGamepad1State.analog + 4));
    Triangle::draw((Triangle *)auStack_1f8);
    Application::reshapeOrtho((Application *)this,fpsCounter.rotationX);
    snprintf(main::outputString,0x32,"frame time: %.2f ms  fps: %d",SUB84((double)frameTime,0),
             (ulong)fps);
    _Var2 = fpsCounter.text._M_dataplus;
    strlen(main::outputString);
    std::__cxx11::string::_M_replace((ulong)&fpsCounter.scale,0,_Var2._M_p,0x19f4b0);
    Text::draw((Text *)((long)&gamepad1._gamepadName.field_2 + 8));
    Application::swapBuffers((Application *)this);
  }
  Application::closeWindow((Application *)&triangle.scale);
  Text::~Text((Text *)((long)&gamepad1._gamepadName.field_2 + 8));
  Texture::~Texture((Texture *)&woodTexture._width);
  Texture::~Texture((Texture *)&grayBrickTexture._width);
  Texture::~Texture((Texture *)&grayBrickImage.texture);
  local_3c0 = (undefined1  [8])&PTR_type_0019dc68;
  if ((size_type *)gamepad1._88_8_ != &gamepad1._gamepadName._M_string_length) {
    operator_delete((void *)gamepad1._88_8_,gamepad1._gamepadName._M_string_length + 1);
  }
  if (gamepad1._rawCallback.super__Function_base._M_functor._8_8_ != 0) {
    (*(code *)gamepad1._rawCallback.super__Function_base._M_functor._8_8_)
              (&gamepad1._gamepadIndex,&gamepad1._gamepadIndex,3);
  }
  std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>::
  ~vector((vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_> *)
          &app._windowWidth);
  if (app._window != (GLFWwindow *)&app._windowName._M_string_length) {
    operator_delete(app._window,
                    CONCAT71(app._windowName._M_string_length._1_7_,
                             (undefined1)app._windowName._M_string_length) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    DEBUG_PRINTLN("Application started!");
    int width = 640;
    int height = 480;
    Application app;
    app.createWindow("GLEX Graphics Example", width, height);

    // Basic gamepad handling
    GamepadState lastGamepad1State;
    GamepadInputHandler gamepad1(GamepadIndex::FIRST);
    gamepad1.registerRawStateCallback([&app, &lastGamepad1State](GamepadState gamepadState) {
        // Store last state
        lastGamepad1State = gamepadState;

        // Check for L + R + Start button combo to exit the app
        if (gamepadState.analog[GamepadAnalog::L_TRIGGER] > 0.9 && gamepadState.analog[GamepadAnalog::R_TRIGGER] > 0.9 && gamepadState.buttons[GamepadButton::START] == GamepadButtonState::PRESSED) {
            DEBUG_PRINTLN("L + R + Start pressed!");
            cleanExit(&app);
        }
    });
    app.addInputHandler(std::shared_ptr<GamepadInputHandler>(&gamepad1));

    // NOTE: Both Image and Mesh classes can use textures loaded from JPG, PNG, or BMP.
    //       All PNG files have been run through pngcrush.
    //
    //       I have not yet done profiling to determine the performance and memory 
    //       implications of using each file format. However keep in mind that only PNG
    //       fully supports RGBA as the others do not have alpha channels. The below test
    //       code demostrates loading all 3 types. You can also change the extensions to 
    //       try the other formats yourself for testing/profiling. 
    //
    //       In my limited testing with dcload only, the file size seems to have a much larger
    //       impact on loading time than the format. So I found JPG files load significantly
    //       faster than either PNG or BMP with no noticeable loss in quality (though no alpha).

    Texture grayBrickTexture;
    grayBrickTexture.loadRGB("images/gray_brick_512.jpg");
    Image grayBrickImage(&grayBrickTexture, 0, (float)app.windowHeight(), Image::Z_BACKGROUND, (float)app.windowWidth(), (float)app.windowHeight(), app.screenScale);

    Texture woodTexture;
    woodTexture.loadRGB("images/wood1.bmp");
    Image woodImage(&woodTexture, 250, 420, 10, Image::Z_HUD, 100, app.screenScale);

    Triangle triangle(250, 220, 10, Image::Z_HUD, 100, app.screenScale);

    MeshData *houseMesh = MeshLoader::loadObjMesh("meshes/house.obj");
    Texture houseTexture;
    houseTexture.loadRGBA("images/house_512.png");
    Mesh mesh(houseMesh, &houseTexture, 0.3f);

    Cube cube;

    FontColor darkBlue{21, 1, 148};
    FontFace fontFace = app.screenScale > 1.0 ? FontFace::arial_28 : FontFace::arial_16;
    Text fpsCounter(fontFace, "", darkBlue, 20, 20, Image::Z_HUD, app.screenScale);
    fpsCounter.createTexture();

#ifdef DREAMCAST
    // Init perf counter
    PMCR_Init(PERF_COUNTER_WHICH, PMCR_ELAPSED_TIME_MODE, PMCR_COUNT_CPU_CYCLES);
    lastTimeMs = PMCR_Read(PERF_COUNTER_WHICH) / PERF_COUNTER_NS_TO_MS;
#endif

    DEBUG_PRINTLN("\n\nPress L + R + Start to exit...");

    // Main loop
    while (!app.windowShouldClose()) {
        // Measure speed
        nbFrames++;

#ifdef DREAMCAST
        currentTimeMs = PMCR_Read(PERF_COUNTER_WHICH) / PERF_COUNTER_NS_TO_MS;
        timeDiff = currentTimeMs - lastTimeMs;
        if (timeDiff >= 1000) {
            frameTime = float(timeDiff) / float(nbFrames);
            fps = nbFrames;
            nbFrames = 0;
            lastTimeMs = currentTimeMs;
        }
#else
        currentTime = std::chrono::high_resolution_clock::now();
        timeDiff = (uint16_t)std::chrono::duration_cast<std::chrono::milliseconds>(currentTime - lastTime).count();
        if (timeDiff >= 1000) {
            frameTime = float(timeDiff) / float(nbFrames);
            fps = nbFrames;
            nbFrames = 0;
            lastTime = currentTime;
        }
#endif

        // Handle input
        app.handleInput();

        // Clear the buffer to draw the prepare frame
        app.clear();

        // Draw the background image
        app.reshapeOrtho(1.0);        
        grayBrickImage.draw();

        // Draw the 3d rotating house
        app.reshapeFrustum();
        mesh.draw();
        mesh.rotationX += 0.75;
        mesh.rotationY += 0.75;
        mesh.rotationZ += 0.75;
        // cube.draw();

        // Draw the foreground 2d image
        app.reshapeOrtho(1.0);
        woodImage.draw();
        triangle.draw();

        // Draw the FPS counter HUD text
        app.reshapeOrtho(fpsCounter.scale);
        static char outputString[50];
        snprintf(&outputString[0], 50, "frame time: %.2f ms  fps: %d", frameTime, fps);
        fpsCounter.text = outputString;
        fpsCounter.draw();

        // Swap buffers to display the current frame
        app.swapBuffers();
    }

    cleanExit(&app);
}